

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O2

Bac_Ntk_t * Bac_ManRoot(Bac_Man_t *p)

{
  int iVar1;
  
  iVar1 = p->iRoot;
  if ((0 < (long)iVar1) && (iVar1 <= p->nNtks)) {
    return p->pNtks + iVar1;
  }
  return (Bac_Ntk_t *)0x0;
}

Assistant:

static inline Bac_Ntk_t *    Bac_ManRoot( Bac_Man_t * p )                    { return Bac_ManNtk(p, p->iRoot);                                                             }